

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O1

bool __thiscall ParsedH264TrackData::spsppsExists(ParsedH264TrackData *this,uint8_t *buff,int size)

{
  uint32_t uVar1;
  ulong uVar2;
  byte bVar3;
  uint32_t *cur32;
  uint32_t *puVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  
  uVar2 = (ulong)this->m_nalSize;
  if (buff < buff + ((long)size - uVar2)) {
    bVar5 = 0;
    bVar7 = 0;
    puVar4 = (uint32_t *)buff;
    do {
      if ((char)uVar2 == '\x04') {
        uVar1 = my_ntohl(*puVar4);
      }
      else {
        uVar1 = (uint)*(byte *)((long)puVar4 + 2) |
                (uint)*(byte *)((long)puVar4 + 1) << 8 | (uint)(byte)*puVar4 << 0x10;
      }
      bVar3 = *(byte *)((long)puVar4 + (ulong)this->m_nalSize) & 0x1f;
      if (bVar3 == 7) {
        bVar5 = 1;
      }
      else if (bVar3 == 8) {
        bVar7 = 1;
      }
      puVar4 = (uint32_t *)((long)puVar4 + (ulong)(uVar1 + this->m_nalSize));
      uVar2 = (ulong)this->m_nalSize;
    } while (puVar4 < buff + ((long)size - uVar2));
    bVar6 = (bool)(bVar5 & bVar7);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ParsedH264TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<NALUnit::NALType>(curPos[m_nalSize] & 0x1f);
        if (nalUnitType == NALUnit::NALType::nuSPS)
            spsFound = true;
        else if (nalUnitType == NALUnit::NALType::nuPPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return spsFound && ppsFound;
}